

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  ulong uVar3;
  float *pfVar4;
  long lVar5;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  
  if (data != (float *)0x0) {
    psVar1 = (stbi_uc *)stbi__malloc_mad3(x,y,4,0);
    if (psVar1 != (stbi_uc *)0x0) {
      if (0 < y * x) {
        uVar3 = 0;
        psVar2 = psVar1;
        pfVar4 = data;
        do {
          lVar5 = 0;
          do {
            fVar6 = powf(pfVar4[lVar5],0.45454544);
            fVar7 = fVar6 * 255.0 + 0.5;
            fVar6 = 0.0;
            if (0.0 <= fVar7) {
              fVar6 = fVar7;
            }
            fVar7 = 255.0;
            if (fVar6 <= 255.0) {
              fVar7 = fVar6;
            }
            psVar2[lVar5] = (stbi_uc)(int)fVar7;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          fVar7 = data[uVar3 * 4 + 3] * 255.0 + 0.5;
          fVar6 = 0.0;
          if (0.0 <= fVar7) {
            fVar6 = fVar7;
          }
          fVar7 = 255.0;
          if (fVar6 <= 255.0) {
            fVar7 = fVar6;
          }
          psVar1[uVar3 * 4 + 3] = (stbi_uc)(int)fVar7;
          uVar3 = uVar3 + 1;
          psVar2 = psVar2 + 4;
          pfVar4 = pfVar4 + 4;
        } while (uVar3 != (uint)(y * x));
      }
      free(data);
      return psVar1;
    }
    free(data);
    *(char **)(in_FS_OFFSET + -8) = "outofmem";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}